

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.h
# Opt level: O0

bool __thiscall CInput::KeyIsPressed(CInput *this,int Key)

{
  bool bVar1;
  undefined8 in_RDI;
  CInput *unaff_retaddr;
  
  bVar1 = KeyState(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  return bVar1;
}

Assistant:

bool KeyIsPressed(int Key) const { return KeyState(Key); }